

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::kotlin::FieldGenerator::GenerateMapField
          (FieldGenerator *this,Printer *printer)

{
  Printer *pPVar1;
  initializer_list<google::protobuf::io::Printer::Sub> v;
  initializer_list<google::protobuf::io::Printer::Sub> v_00;
  initializer_list<google::protobuf::io::Printer::Sub> v_01;
  initializer_list<google::protobuf::io::Printer::Sub> v_02;
  initializer_list<google::protobuf::io::Printer::Sub> v_03;
  initializer_list<google::protobuf::io::Printer::Sub> v_04;
  initializer_list<google::protobuf::io::Printer::Sub> v_05;
  ClassNameResolver *field;
  ClassNameResolver *this_00;
  Options *pOVar2;
  ClassNameResolver *name_resolver_00;
  undefined1 uVar3;
  undefined8 in_R8;
  Sub *local_d78;
  Sub *local_d38;
  Sub *local_cf8;
  Sub *local_cb8;
  Sub *local_c78;
  Sub *local_c38;
  Sub *local_be0;
  basic_string_view<char,_std::char_traits<char>_> local_ba8;
  undefined1 local_b91;
  anon_class_8_1_55a613f1_for_cb local_b90;
  allocator<char> local_b81;
  string local_b80;
  Sub *local_b60;
  Sub local_b58;
  iterator local_aa0;
  size_type local_a98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_a90;
  FieldDescriptor local_a80;
  basic_string_view<char,_std::char_traits<char>_> local_a28;
  undefined1 local_a11;
  anon_class_8_1_55a613f1_for_cb local_a10;
  allocator<char> local_a01;
  string local_a00;
  Sub *local_9e0;
  Sub local_9d8;
  iterator local_920;
  size_type local_918;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_910;
  FieldDescriptor local_900;
  basic_string_view<char,_std::char_traits<char>_> local_8a8;
  undefined1 local_891;
  anon_class_8_1_55a613f1_for_cb local_890;
  allocator<char> local_881;
  string local_880;
  Sub *local_860;
  Sub local_858;
  iterator local_7a0;
  size_type local_798;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_790;
  FieldDescriptor local_780;
  basic_string_view<char,_std::char_traits<char>_> local_728;
  undefined1 local_711;
  anon_class_8_1_55a613f1_for_cb local_710;
  allocator<char> local_701;
  string local_700;
  Sub *local_6e0;
  Sub local_6d8;
  iterator local_620;
  size_type local_618;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_610;
  FieldDescriptor local_600;
  basic_string_view<char,_std::char_traits<char>_> local_5a8;
  undefined1 local_591;
  anon_class_8_1_55a613f1_for_cb local_590;
  allocator<char> local_581;
  string local_580;
  Sub *local_560;
  Sub local_558;
  iterator local_4a0;
  size_type local_498;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_490;
  FieldDescriptor local_480;
  basic_string_view<char,_std::char_traits<char>_> local_428;
  undefined1 local_411;
  anon_class_8_1_55a613f1_for_cb local_410;
  allocator<char> local_401;
  string local_400;
  Sub *local_3e0;
  Sub local_3d8;
  iterator local_320;
  size_type local_318;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_310;
  undefined1 local_300 [80];
  undefined1 local_2b0 [24];
  JvmNameContext name_ctx;
  string local_280;
  allocator<char> local_259;
  string local_258;
  string local_238;
  allocator<char> local_201;
  string local_200;
  Sub *local_1e0;
  Sub local_1d8;
  Sub local_120;
  iterator local_68;
  size_type local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_58;
  undefined1 local_48 [8];
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  cleanup;
  FieldDescriptor *value;
  FieldDescriptor *key;
  ClassNameResolver *name_resolver;
  Printer *printer_local;
  FieldGenerator *this_local;
  
  field = java::Context::GetNameResolver(this->context_);
  this_00 = (ClassNameResolver *)java::MapKeyField(this->descriptor_);
  name_resolver_00 = this_00;
  cleanup.storage_.callback_buffer_._8_8_ = java::MapValueField(this->descriptor_);
  name_ctx._23_1_ = 1;
  local_1e0 = &local_1d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_200,"kt_key_type",&local_201);
  kotlin::(anonymous_namespace)::KotlinTypeName_abi_cxx11_
            (&local_238,(_anonymous_namespace_ *)this_00,(FieldDescriptor *)field,name_resolver_00);
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_1d8,&local_200,&local_238);
  local_1e0 = &local_120;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"kt_value_type",&local_259);
  kotlin::(anonymous_namespace)::KotlinTypeName_abi_cxx11_
            (&local_280,(_anonymous_namespace_ *)cleanup.storage_.callback_buffer_._8_8_,
             (FieldDescriptor *)field,name_resolver_00);
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_120,&local_258,&local_280);
  name_ctx._23_1_ = 0;
  local_68 = &local_1d8;
  local_60 = 2;
  v_05._M_len = 2;
  v_05._M_array = local_68;
  absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
  Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
            ((Span<google::protobuf::io::Printer::Sub_const> *)local_58._M_local_buf,v_05);
  io::Printer::WithVars
            ((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
              *)local_48,printer,(Span<const_google::protobuf::io::Printer::Sub>)local_58);
  local_be0 = (Sub *)&local_68;
  do {
    local_be0 = local_be0 + -1;
    io::Printer::Sub::~Sub(local_be0);
    uVar3 = (undefined1)in_R8;
  } while (local_be0 != &local_1d8);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator(&local_259);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator(&local_201);
  local_2b0._16_8_ = java::Context::options(this->context_);
  name_ctx.printer._0_1_ = this->lite_ & 1;
  name_ctx.options = (Options *)printer;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)local_2b0,
             "/**\n * An uninstantiable, behaviorless type to represent the field in\n * generics.\n */\n@kotlin.OptIn(com.google.protobuf.kotlin.OnlyForUseByGeneratedProtoCode::class)\npublic class ${$$kt_capitalized_name$Proxy$}$ private constructor() : com.google.protobuf.kotlin.DslProxy()\n"
            );
  io::Printer::Print<>(printer,(string_view)local_2b0._0_16_);
  pPVar1 = (Printer *)this->descriptor_;
  pOVar2 = java::Context::options(this->context_);
  java::Options::Options((Options *)local_300,pOVar2);
  java::WriteFieldDocComment
            ((java *)printer,pPVar1,(FieldDescriptor *)local_300,(Options *)0x1,(bool)uVar3);
  java::Options::~Options((Options *)local_300);
  local_411 = 1;
  local_3e0 = &local_3d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_400,"jvm_name",&local_401);
  local_410.name_ctx = (JvmNameContext *)(local_2b0 + 0x10);
  io::Printer::Sub::
  Sub<google::protobuf::compiler::kotlin::FieldGenerator::GenerateMapField(google::protobuf::io::Printer*)const::__0>
            (&local_3d8,&local_400,&local_410);
  local_411 = 0;
  local_320 = &local_3d8;
  local_318 = 1;
  v_04._M_len = 1;
  v_04._M_array = local_320;
  absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
  Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
            ((Span<google::protobuf::io::Printer::Sub_const> *)local_310._M_local_buf,v_04);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_428,
             "$kt_deprecation$ public val $kt_name$: com.google.protobuf.kotlin.DslMap<$kt_key_type$, $kt_value_type$, ${$$kt_capitalized_name$Proxy$}$>\n$  jvm_synthetic$$jvm_name$  get() = com.google.protobuf.kotlin.DslMap(\n    $kt_dsl_builder$.${$$kt_property_name$Map$}$\n  )\n"
            );
  io::Printer::SourceLocation::current();
  io::Printer::Emit(printer,local_310._M_allocated_capacity,local_310._8_8_,local_428._M_len);
  local_c38 = (Sub *)&local_320;
  do {
    local_c38 = local_c38 + -1;
    io::Printer::Sub::~Sub(local_c38);
    uVar3 = SUB81(local_428._M_str,0);
  } while (local_c38 != &local_3d8);
  std::__cxx11::string::~string((string *)&local_400);
  std::allocator<char>::~allocator(&local_401);
  pPVar1 = (Printer *)this->descriptor_;
  pOVar2 = java::Context::options(this->context_);
  java::Options::Options((Options *)&local_480,pOVar2);
  java::WriteFieldDocComment((java *)printer,pPVar1,&local_480,(Options *)0x1,(bool)uVar3);
  java::Options::~Options((Options *)&local_480);
  local_591 = 1;
  local_560 = &local_558;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_580,"jvm_name",&local_581);
  local_590.name_ctx = (JvmNameContext *)(local_2b0 + 0x10);
  io::Printer::Sub::
  Sub<google::protobuf::compiler::kotlin::FieldGenerator::GenerateMapField(google::protobuf::io::Printer*)const::__1>
            (&local_558,&local_580,&local_590);
  local_591 = 0;
  local_4a0 = &local_558;
  local_498 = 1;
  v_03._M_len = 1;
  v_03._M_array = local_4a0;
  absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
  Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
            ((Span<google::protobuf::io::Printer::Sub_const> *)local_490._M_local_buf,v_03);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_5a8,
             "$jvm_name$public fun com.google.protobuf.kotlin.DslMap<$kt_key_type$, $kt_value_type$, ${$$kt_capitalized_name$Proxy$}$>\n  .put(key: $kt_key_type$, value: $kt_value_type$) {\n     $kt_dsl_builder$.${$put$capitalized_name$$}$(key, value)\n   }\n"
            );
  io::Printer::SourceLocation::current();
  io::Printer::Emit(printer,local_490._M_allocated_capacity,local_490._8_8_,local_5a8._M_len);
  local_c78 = (Sub *)&local_4a0;
  do {
    local_c78 = local_c78 + -1;
    io::Printer::Sub::~Sub(local_c78);
    uVar3 = SUB81(local_5a8._M_str,0);
  } while (local_c78 != &local_558);
  std::__cxx11::string::~string((string *)&local_580);
  std::allocator<char>::~allocator(&local_581);
  pPVar1 = (Printer *)this->descriptor_;
  pOVar2 = java::Context::options(this->context_);
  java::Options::Options((Options *)&local_600,pOVar2);
  java::WriteFieldDocComment((java *)printer,pPVar1,&local_600,(Options *)0x1,(bool)uVar3);
  java::Options::~Options((Options *)&local_600);
  local_711 = 1;
  local_6e0 = &local_6d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_700,"jvm_name",&local_701);
  local_710.name_ctx = (JvmNameContext *)(local_2b0 + 0x10);
  io::Printer::Sub::
  Sub<google::protobuf::compiler::kotlin::FieldGenerator::GenerateMapField(google::protobuf::io::Printer*)const::__2>
            (&local_6d8,&local_700,&local_710);
  local_711 = 0;
  local_620 = &local_6d8;
  local_618 = 1;
  v_02._M_len = 1;
  v_02._M_array = local_620;
  absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
  Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
            ((Span<google::protobuf::io::Printer::Sub_const> *)local_610._M_local_buf,v_02);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_728,
             "$jvm_synthetic$$jvm_name$@Suppress(\"NOTHING_TO_INLINE\")\npublic inline operator fun com.google.protobuf.kotlin.DslMap<$kt_key_type$, $kt_value_type$, ${$$kt_capitalized_name$Proxy$}$>\n  .set(key: $kt_key_type$, value: $kt_value_type$) {\n     put(key, value)\n   }\n"
            );
  io::Printer::SourceLocation::current();
  io::Printer::Emit(printer,local_610._M_allocated_capacity,local_610._8_8_,local_728._M_len);
  local_cb8 = (Sub *)&local_620;
  do {
    local_cb8 = local_cb8 + -1;
    io::Printer::Sub::~Sub(local_cb8);
    uVar3 = SUB81(local_728._M_str,0);
  } while (local_cb8 != &local_6d8);
  std::__cxx11::string::~string((string *)&local_700);
  std::allocator<char>::~allocator(&local_701);
  pPVar1 = (Printer *)this->descriptor_;
  pOVar2 = java::Context::options(this->context_);
  java::Options::Options((Options *)&local_780,pOVar2);
  java::WriteFieldDocComment((java *)printer,pPVar1,&local_780,(Options *)0x1,(bool)uVar3);
  java::Options::~Options((Options *)&local_780);
  local_891 = 1;
  local_860 = &local_858;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_880,"jvm_name",&local_881);
  local_890.name_ctx = (JvmNameContext *)(local_2b0 + 0x10);
  io::Printer::Sub::
  Sub<google::protobuf::compiler::kotlin::FieldGenerator::GenerateMapField(google::protobuf::io::Printer*)const::__3>
            (&local_858,&local_880,&local_890);
  local_891 = 0;
  local_7a0 = &local_858;
  local_798 = 1;
  v_01._M_len = 1;
  v_01._M_array = local_7a0;
  absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
  Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
            ((Span<google::protobuf::io::Printer::Sub_const> *)local_790._M_local_buf,v_01);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_8a8,
             "$jvm_synthetic$$jvm_name$public fun com.google.protobuf.kotlin.DslMap<$kt_key_type$, $kt_value_type$, ${$$kt_capitalized_name$Proxy$}$>\n  .remove(key: $kt_key_type$) {\n     $kt_dsl_builder$.${$remove$capitalized_name$$}$(key)\n   }\n"
            );
  io::Printer::SourceLocation::current();
  io::Printer::Emit(printer,local_790._M_allocated_capacity,local_790._8_8_,local_8a8._M_len);
  local_cf8 = (Sub *)&local_7a0;
  do {
    local_cf8 = local_cf8 + -1;
    io::Printer::Sub::~Sub(local_cf8);
    uVar3 = SUB81(local_8a8._M_str,0);
  } while (local_cf8 != &local_858);
  std::__cxx11::string::~string((string *)&local_880);
  std::allocator<char>::~allocator(&local_881);
  pPVar1 = (Printer *)this->descriptor_;
  pOVar2 = java::Context::options(this->context_);
  java::Options::Options((Options *)&local_900,pOVar2);
  java::WriteFieldDocComment((java *)printer,pPVar1,&local_900,(Options *)0x1,(bool)uVar3);
  java::Options::~Options((Options *)&local_900);
  local_a11 = 1;
  local_9e0 = &local_9d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a00,"jvm_name",&local_a01);
  local_a10.name_ctx = (JvmNameContext *)(local_2b0 + 0x10);
  io::Printer::Sub::
  Sub<google::protobuf::compiler::kotlin::FieldGenerator::GenerateMapField(google::protobuf::io::Printer*)const::__4>
            (&local_9d8,&local_a00,&local_a10);
  local_a11 = 0;
  local_920 = &local_9d8;
  local_918 = 1;
  v_00._M_len = 1;
  v_00._M_array = local_920;
  absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
  Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
            ((Span<google::protobuf::io::Printer::Sub_const> *)local_910._M_local_buf,v_00);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_a28,
             "$jvm_synthetic$$jvm_name$public fun com.google.protobuf.kotlin.DslMap<$kt_key_type$, $kt_value_type$, ${$$kt_capitalized_name$Proxy$}$>\n  .putAll(map: kotlin.collections.Map<$kt_key_type$, $kt_value_type$>) {\n     $kt_dsl_builder$.${$putAll$capitalized_name$$}$(map)\n   }\n"
            );
  io::Printer::SourceLocation::current();
  io::Printer::Emit(printer,local_910._M_allocated_capacity,local_910._8_8_,local_a28._M_len);
  local_d38 = (Sub *)&local_920;
  do {
    local_d38 = local_d38 + -1;
    io::Printer::Sub::~Sub(local_d38);
    uVar3 = SUB81(local_a28._M_str,0);
  } while (local_d38 != &local_9d8);
  std::__cxx11::string::~string((string *)&local_a00);
  std::allocator<char>::~allocator(&local_a01);
  pPVar1 = (Printer *)this->descriptor_;
  pOVar2 = java::Context::options(this->context_);
  java::Options::Options((Options *)&local_a80,pOVar2);
  java::WriteFieldDocComment((java *)printer,pPVar1,&local_a80,(Options *)0x1,(bool)uVar3);
  java::Options::~Options((Options *)&local_a80);
  local_b91 = 1;
  local_b60 = &local_b58;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b80,"jvm_name",&local_b81);
  local_b90.name_ctx = (JvmNameContext *)(local_2b0 + 0x10);
  io::Printer::Sub::
  Sub<google::protobuf::compiler::kotlin::FieldGenerator::GenerateMapField(google::protobuf::io::Printer*)const::__5>
            (&local_b58,&local_b80,&local_b90);
  local_b91 = 0;
  local_aa0 = &local_b58;
  local_a98 = 1;
  v._M_len = 1;
  v._M_array = local_aa0;
  absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
  Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
            ((Span<google::protobuf::io::Printer::Sub_const> *)local_a90._M_local_buf,v);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_ba8,
             "$jvm_synthetic$$jvm_name$public fun com.google.protobuf.kotlin.DslMap<$kt_key_type$, $kt_value_type$, ${$$kt_capitalized_name$Proxy$}$>\n  .clear() {\n     $kt_dsl_builder$.${$clear$capitalized_name$$}$()\n   }\n"
            );
  io::Printer::SourceLocation::current();
  io::Printer::Emit(printer,local_a90._M_allocated_capacity,local_a90._8_8_,local_ba8._M_len,
                    local_ba8._M_str);
  local_d78 = (Sub *)&local_aa0;
  do {
    local_d78 = local_d78 + -1;
    io::Printer::Sub::~Sub(local_d78);
  } while (local_d78 != &local_b58);
  std::__cxx11::string::~string((string *)&local_b80);
  std::allocator<char>::~allocator(&local_b81);
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
  ::~Cleanup((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
              *)local_48);
  return;
}

Assistant:

void FieldGenerator::GenerateMapField(io::Printer* printer) const {
  auto name_resolver = context_->GetNameResolver();
  const FieldDescriptor* key = java::MapKeyField(descriptor_);
  const FieldDescriptor* value = java::MapValueField(descriptor_);
  auto cleanup = printer->WithVars(
      {{"kt_key_type", KotlinTypeName(key, name_resolver)},
       {"kt_value_type", KotlinTypeName(value, name_resolver)}});

  java::JvmNameContext name_ctx = {context_->options(), printer, lite_};
  printer->Print(
      "/**\n"
      " * An uninstantiable, behaviorless type to represent the field in\n"
      " * generics.\n"
      " */\n"
      "@kotlin.OptIn"
      "(com.google.protobuf.kotlin.OnlyForUseByGeneratedProtoCode::class)\n"
      "public class ${$$kt_capitalized_name$Proxy$}$ private constructor()"
      " : com.google.protobuf.kotlin.DslProxy()\n");

  WriteFieldDocComment(printer, descriptor_, context_->options(),
                       /* kdoc */ true);
  printer->Emit(
      {
          {"jvm_name",
           [&] { JvmName("get$kt_capitalized_name$Map", name_ctx); }},
      },
      "$kt_deprecation$ public val $kt_name$: "
      "com.google.protobuf.kotlin.DslMap"
      "<$kt_key_type$, $kt_value_type$, ${$$kt_capitalized_name$Proxy$}$>\n"
      "$  jvm_synthetic$"
      "$jvm_name$"
      "  get() = com.google.protobuf.kotlin.DslMap(\n"
      "    $kt_dsl_builder$.${$$kt_property_name$Map$}$\n"
      "  )\n");

  WriteFieldDocComment(printer, descriptor_, context_->options(),
                       /* kdoc */ true);
  printer->Emit(
      {
          {"jvm_name", [&] { JvmName("put$kt_capitalized_name$", name_ctx); }},
      },
      "$jvm_name$"
      "public fun com.google.protobuf.kotlin.DslMap"
      "<$kt_key_type$, $kt_value_type$, ${$$kt_capitalized_name$Proxy$}$>\n"
      "  .put(key: $kt_key_type$, value: $kt_value_type$) {\n"
      "     $kt_dsl_builder$.${$put$capitalized_name$$}$(key, value)\n"
      "   }\n");

  WriteFieldDocComment(printer, descriptor_, context_->options(),
                       /* kdoc */ true);
  printer->Emit(
      {
          {"jvm_name", [&] { JvmName("set$kt_capitalized_name$", name_ctx); }},
      },
      "$jvm_synthetic$"
      "$jvm_name$"
      "@Suppress(\"NOTHING_TO_INLINE\")\n"
      "public inline operator fun com.google.protobuf.kotlin.DslMap"
      "<$kt_key_type$, $kt_value_type$, ${$$kt_capitalized_name$Proxy$}$>\n"
      "  .set(key: $kt_key_type$, value: $kt_value_type$) {\n"
      "     put(key, value)\n"
      "   }\n");

  WriteFieldDocComment(printer, descriptor_, context_->options(),
                       /* kdoc */ true);
  printer->Emit(
      {
          {"jvm_name",
           [&] { JvmName("remove$kt_capitalized_name$", name_ctx); }},
      },
      "$jvm_synthetic$"
      "$jvm_name$"
      "public fun com.google.protobuf.kotlin.DslMap"
      "<$kt_key_type$, $kt_value_type$, ${$$kt_capitalized_name$Proxy$}$>\n"
      "  .remove(key: $kt_key_type$) {\n"
      "     $kt_dsl_builder$.${$remove$capitalized_name$$}$(key)\n"
      "   }\n");

  WriteFieldDocComment(printer, descriptor_, context_->options(),
                       /* kdoc */ true);
  printer->Emit(
      {
          {"jvm_name",
           [&] { JvmName("putAll$kt_capitalized_name$", name_ctx); }},
      },
      "$jvm_synthetic$"
      "$jvm_name$"
      "public fun com.google.protobuf.kotlin.DslMap"
      "<$kt_key_type$, $kt_value_type$, ${$$kt_capitalized_name$Proxy$}$>\n"
      "  .putAll(map: kotlin.collections.Map<$kt_key_type$, $kt_value_type$>) "
      "{\n"
      "     $kt_dsl_builder$.${$putAll$capitalized_name$$}$(map)\n"
      "   }\n");

  WriteFieldDocComment(printer, descriptor_, context_->options(),
                       /* kdoc */ true);
  printer->Emit(
      {
          {"jvm_name",
           [&] { JvmName("clear$kt_capitalized_name$", name_ctx); }},
      },
      "$jvm_synthetic$"
      "$jvm_name$"
      "public fun com.google.protobuf.kotlin.DslMap"
      "<$kt_key_type$, $kt_value_type$, ${$$kt_capitalized_name$Proxy$}$>\n"
      "  .clear() {\n"
      "     $kt_dsl_builder$.${$clear$capitalized_name$$}$()\n"
      "   }\n");
}